

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O3

string * StringBuilder<char[8],int_const&,char_const(&)[4]>
                   (string *__return_storage_ptr__,char (*arg) [8],int *args,char (*args_1) [4])

{
  size_type *psVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  string local_58;
  ulong *local_38;
  long local_30;
  ulong local_28 [2];
  
  std::__cxx11::string::string((string *)&local_38,*arg,(allocator *)&local_58);
  StringBuilder<int,char_const(&)[4]>(&local_58,args,args_1);
  uVar3 = 0xf;
  if (local_38 != local_28) {
    uVar3 = local_28[0];
  }
  if (uVar3 < local_58._M_string_length + local_30) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar4 = local_58.field_2._M_allocated_capacity;
    }
    if (local_58._M_string_length + local_30 <= (ulong)uVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
      goto LAB_0013d48e;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58._M_dataplus._M_p);
LAB_0013d48e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar1) {
    uVar4 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}